

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::RenamedInterface::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,_capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>
  CVar1;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  undefined8 extraout_RDX;
  undefined6 in_register_00000032;
  long *plVar3;
  DispatchCallResult DVar4;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar2;
  
  plVar3 = (long *)CONCAT62(in_register_00000032,methodId);
  if ((short)context.hook == 0) {
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>
                      ((Server *)((long)plVar3 + *(long *)(*plVar3 + -0x18)),in_RCX);
    (**(code **)(*plVar3 + 8))(this,plVar3,CVar1.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar2 = extraout_RDX;
  }
  else {
    DVar4 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar3 + *(long *)(*plVar3 + -0x18)),0x491ee7,
                       0x918b);
    uVar2 = DVar4._8_8_;
  }
  DVar4.isStreaming = (bool)(char)uVar2;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult RenamedInterface::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        renamedMethod(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::RenamedInterface::RenamedMethodParams,  ::capnproto_test::capnp::test::RenamedInterface::RenamedMethodResults>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestNameAnnotationInterface",
          0xd112a69d31ed918bull, methodId);
  }
}